

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl.cxx
# Opt level: O2

void fl_throw_focus(Fl_Widget *o)

{
  int iVar1;
  
  iVar1 = Fl_Widget::contains(o,Fl::pushed_);
  if (iVar1 != 0) {
    Fl::pushed_ = (Fl_Widget *)0x0;
  }
  iVar1 = Fl_Widget::contains(o,fl_selection_requestor);
  if (iVar1 != 0) {
    fl_selection_requestor = (Fl_Widget *)0x0;
  }
  iVar1 = Fl_Widget::contains(o,Fl::belowmouse_);
  if (iVar1 != 0) {
    Fl::belowmouse_ = (Fl_Widget *)0x0;
  }
  iVar1 = Fl_Widget::contains(o,Fl::focus_);
  if (iVar1 != 0) {
    Fl::focus_ = (Fl_Widget *)0x0;
  }
  if (fl_xfocus == (Fl_Window *)o) {
    fl_xfocus = (Fl_Window *)0x0;
  }
  if (Fl_Tooltip::widget_ == o) {
    Fl_Tooltip::current((Fl_Widget *)0x0);
  }
  if (fl_xmousewin == (Fl_Window *)o) {
    fl_xmousewin = (Fl_Window *)0x0;
  }
  (*Fl_Tooltip::exit)(o);
  fl_fix_focus();
  return;
}

Assistant:

void fl_throw_focus(Fl_Widget *o) {
#ifdef DEBUG
  printf("fl_throw_focus(o=%p)\n", o);
#endif // DEBUG

  if (o->contains(Fl::pushed())) Fl::pushed_ = 0;
#if !(defined(WIN32) || defined(__APPLE__))
  if (o->contains(fl_selection_requestor)) fl_selection_requestor = 0;
#endif
  if (o->contains(Fl::belowmouse())) Fl::belowmouse_ = 0;
  if (o->contains(Fl::focus())) Fl::focus_ = 0;
  if (o == fl_xfocus) fl_xfocus = 0;
  if (o == Fl_Tooltip::current()) Fl_Tooltip::current(0);
  if (o == fl_xmousewin) fl_xmousewin = 0;
  Fl_Tooltip::exit(o);
  fl_fix_focus();
}